

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactMeshShapePart *shape0,
          btStaticPlaneShape *shape1,bool swapped)

{
  btTransform *pbVar1;
  long lVar2;
  ulong uVar3;
  btCollisionObjectWrapper *body1Wrap_00;
  int iVar4;
  btCollisionObjectWrapper *body0Wrap_00;
  btVector3 *normal;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btTransform orgtrans0;
  btVector3 local_d8;
  btVector3 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  btVector3 local_60;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  
  pbVar1 = body0Wrap->m_worldTransform;
  local_b8 = *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
  uStack_b0 = *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
  local_a8 = *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
  uStack_a0 = *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
  local_98 = *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
  uStack_90 = *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
  local_88 = *(undefined8 *)(pbVar1->m_origin).m_floats;
  uStack_80 = *(undefined8 *)((pbVar1->m_origin).m_floats + 2);
  pbVar1 = body1Wrap->m_worldTransform;
  fVar7 = (shape1->m_planeNormal).m_floats[0];
  fVar9 = (shape1->m_planeNormal).m_floats[1];
  fVar5 = (shape1->m_planeNormal).m_floats[2];
  local_78 = fVar5 * (pbVar1->m_basis).m_el[0].m_floats[2] +
             fVar7 * (pbVar1->m_basis).m_el[0].m_floats[0] +
             fVar9 * (pbVar1->m_basis).m_el[0].m_floats[1];
  fStack_74 = fVar5 * (pbVar1->m_basis).m_el[1].m_floats[2] +
              fVar7 * (pbVar1->m_basis).m_el[1].m_floats[0] +
              fVar9 * (pbVar1->m_basis).m_el[1].m_floats[1];
  fStack_70 = fVar5 * 0.0 + fVar7 * 0.0 + fVar9 * 0.0;
  fStack_6c = fVar5 * 0.0 + fVar7 * 0.0 + fVar9 * 0.0;
  local_d8.m_floats._0_8_ = CONCAT44(fStack_74,local_78);
  fVar11 = (pbVar1->m_basis).m_el[2].m_floats[2] * fVar5 +
           (pbVar1->m_basis).m_el[2].m_floats[0] * fVar7 +
           (pbVar1->m_basis).m_el[2].m_floats[1] * fVar9;
  fVar12 = (pbVar1->m_origin).m_floats[2] * fVar5 +
           (pbVar1->m_origin).m_floats[0] * fVar7 + (pbVar1->m_origin).m_floats[1] * fVar9 +
           shape1->m_planeConstant;
  local_d8.m_floats[2] = fVar11;
  local_d8.m_floats[3] = fVar12;
  (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[2])(shape0,&local_b8,&local_50,&local_40);
  (*(shape1->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(shape1);
  fVar7 = (float)local_50 - extraout_XMM0_Da;
  fVar9 = (float)((ulong)local_50 >> 0x20) - extraout_XMM0_Da;
  local_50 = CONCAT44(fVar9,fVar7);
  local_48 = local_48 - extraout_XMM0_Da;
  fVar5 = (float)local_40 + extraout_XMM0_Da;
  fVar6 = (float)((ulong)local_40 >> 0x20) + extraout_XMM0_Da;
  local_40 = CONCAT44(fVar6,fVar5);
  local_38 = extraout_XMM0_Da + local_38;
  fVar8 = (fVar7 + fVar5) * 0.5;
  fVar10 = (fVar9 + fVar6) * 0.5;
  fVar7 = (local_48 + local_38) * 0.5;
  fVar9 = fVar7 * fVar11 + fVar8 * local_78 + fVar10 * fStack_74;
  fVar7 = ABS(fVar11) * (local_38 - fVar7) +
          ABS(local_78) * (fVar5 - fVar8) + ABS(fStack_74) * (fVar6 - fVar10);
  if ((fVar9 - fVar7 <= fVar12 + 1e-06) && (fVar12 <= fVar9 + fVar7 + 1e-06)) {
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1c])(shape0);
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(shape0);
    (*(shape1->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(shape1);
    iVar4 = *(int *)&shape0->field_0xf0;
    if (iVar4 != 0) {
      do {
        iVar4 = iVar4 + -1;
        uVar3 = (ulong)(uint)(*(int *)&shape0->field_0xf8 * iVar4);
        lVar2 = *(long *)&shape0->field_0xe8;
        if (*(int *)&shape0->field_0xf4 == 1) {
          fVar9 = (float)((double)*(float *)&shape0->field_0xd0 * *(double *)(lVar2 + uVar3));
          fVar7 = (float)((double)*(float *)&shape0->field_0xd4 * ((double *)(lVar2 + uVar3))[1]);
          fVar5 = (float)((double)*(float *)&shape0->field_0xd8 * *(double *)(lVar2 + 0x10 + uVar3))
          ;
        }
        else {
          fVar9 = *(float *)&shape0->field_0xd0 * *(float *)(lVar2 + uVar3);
          fVar7 = *(float *)&shape0->field_0xd4 * *(float *)(lVar2 + 4 + uVar3);
          fVar5 = *(float *)(lVar2 + 8 + uVar3) * *(float *)&shape0->field_0xd8;
        }
        fVar6 = (float)uStack_90 * fVar5 + (float)local_98 * fVar9 + local_98._4_4_ * fVar7 +
                (float)uStack_80;
        fVar8 = (float)local_88 +
                (float)uStack_b0 * fVar5 + (float)local_b8 * fVar9 + local_b8._4_4_ * fVar7;
        fVar7 = (float)((ulong)local_88 >> 0x20) +
                (float)uStack_a0 * fVar5 + (float)local_a8 * fVar9 + local_a8._4_4_ * fVar7;
        local_c8.m_floats[1] = fVar7;
        local_c8.m_floats[0] = fVar8;
        local_c8.m_floats[2] = fVar6;
        local_c8.m_floats[3] = 0.0;
        fVar7 = ((fVar6 * local_d8.m_floats[2] +
                 fVar8 * local_d8.m_floats[0] + fVar7 * local_d8.m_floats[1]) - local_d8.m_floats[3]
                ) - (extraout_XMM0_Da_00 + extraout_XMM0_Da_01);
        if (fVar7 < 0.0) {
          if (swapped) {
            local_60.m_floats[2] = -local_d8.m_floats[2];
            local_60.m_floats[0] = (btScalar)(int)(local_d8.m_floats._0_8_ ^ 0x8000000080000000);
            local_60.m_floats[1] =
                 (btScalar)(int)((local_d8.m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
            local_60.m_floats[3] = 0.0;
            normal = &local_60;
            body1Wrap_00 = body0Wrap;
            body0Wrap_00 = body1Wrap;
          }
          else {
            normal = &local_d8;
            body1Wrap_00 = body1Wrap;
            body0Wrap_00 = body0Wrap;
          }
          addContactPoint(this,body0Wrap_00,body1Wrap_00,&local_c8,normal,fVar7);
        }
      } while (iVar4 != 0);
    }
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(shape0);
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision(
					  const btCollisionObjectWrapper * body0Wrap,
					  const btCollisionObjectWrapper * body1Wrap,
					  const btGImpactMeshShapePart * shape0,
					  const btStaticPlaneShape * shape1,bool swapped)
{


	btTransform orgtrans0 = body0Wrap->getWorldTransform();
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	const btPlaneShape * planeshape = static_cast<const btPlaneShape *>(shape1);
	btVector4 plane;
	planeshape->get_plane_equation_transformed(orgtrans1,plane);

	//test box against plane

	btAABB tribox;
	shape0->getAabb(orgtrans0,tribox.m_min,tribox.m_max);
	tribox.increment_margin(planeshape->getMargin());

	if( tribox.plane_classify(plane)!= BT_CONST_COLLIDE_PLANE) return;

	shape0->lockChildShapes();

	btScalar margin = shape0->getMargin() + planeshape->getMargin();

	btVector3 vertex;
	int vi = shape0->getVertexCount();
	while(vi--)
	{
		shape0->getVertex(vi,vertex);
		vertex = orgtrans0(vertex);

		btScalar distance = vertex.dot(plane) - plane[3] - margin;

		if(distance<0.0)//add contact
		{
			if(swapped)
			{
				addContactPoint(body1Wrap, body0Wrap,
					vertex,
					-plane,
					distance);
			}
			else
			{
				addContactPoint(body0Wrap, body1Wrap,
					vertex,
					plane,
					distance);
			}
		}
	}

	shape0->unlockChildShapes();
}